

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlNewNs(xmlNodePtr node,xmlChar *href,xmlChar *prefix)

{
  int iVar1;
  xmlChar *pxVar2;
  _xmlNode *p_Var3;
  xmlNs *local_38;
  xmlNsPtr prev;
  xmlNsPtr cur;
  xmlChar *prefix_local;
  xmlChar *href_local;
  xmlNodePtr node_local;
  
  if ((node == (xmlNodePtr)0x0) || (node->type == XML_ELEMENT_NODE)) {
    if ((prefix == (xmlChar *)0x0) ||
       ((iVar1 = xmlStrEqual(prefix,"xml"), iVar1 == 0 ||
        (iVar1 = xmlStrEqual(href,(xmlChar *)"http://www.w3.org/XML/1998/namespace"), iVar1 == 0))))
    {
      node_local = (xmlNodePtr)(*xmlMalloc)(0x30);
      if (node_local == (xmlNodePtr)0x0) {
        xmlTreeErrMemory("building namespace");
        node_local = (xmlNodePtr)0x0;
      }
      else {
        memset(node_local,0,0x30);
        node_local->type = XML_NAMESPACE_DECL;
        if (href != (xmlChar *)0x0) {
          pxVar2 = xmlStrdup(href);
          node_local->name = pxVar2;
        }
        if (prefix != (xmlChar *)0x0) {
          p_Var3 = (_xmlNode *)xmlStrdup(prefix);
          node_local->children = p_Var3;
        }
        if (node != (xmlNodePtr)0x0) {
          if (node->nsDef == (xmlNs *)0x0) {
            node->nsDef = (xmlNs *)node_local;
          }
          else {
            local_38 = node->nsDef;
            if (((local_38->prefix == (xmlChar *)0x0) && (node_local->children == (_xmlNode *)0x0))
               || (iVar1 = xmlStrEqual(local_38->prefix,(xmlChar *)node_local->children), iVar1 != 0
                  )) {
              xmlFreeNs((xmlNsPtr)node_local);
              node_local = (xmlNodePtr)0x0;
            }
            else {
              do {
                if (local_38->next == (_xmlNs *)0x0) {
                  local_38->next = (_xmlNs *)node_local;
                  return (xmlNsPtr)node_local;
                }
                local_38 = local_38->next;
              } while (((local_38->prefix != (xmlChar *)0x0) ||
                       (node_local->children != (_xmlNode *)0x0)) &&
                      (iVar1 = xmlStrEqual(local_38->prefix,(xmlChar *)node_local->children),
                      iVar1 == 0));
              xmlFreeNs((xmlNsPtr)node_local);
              node_local = (xmlNodePtr)0x0;
            }
          }
        }
      }
    }
    else {
      node_local = (xmlNodePtr)0x0;
    }
  }
  else {
    node_local = (xmlNodePtr)0x0;
  }
  return (xmlNsPtr)node_local;
}

Assistant:

xmlNsPtr
xmlNewNs(xmlNodePtr node, const xmlChar *href, const xmlChar *prefix) {
    xmlNsPtr cur;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE))
	return(NULL);

    if ((prefix != NULL) && (xmlStrEqual(prefix, BAD_CAST "xml"))) {
        /* xml namespace is predefined, no need to add it */
        if (xmlStrEqual(href, XML_XML_NAMESPACE))
            return(NULL);

        /*
         * Problem, this is an attempt to bind xml prefix to a wrong
         * namespace, which breaks
         * Namespace constraint: Reserved Prefixes and Namespace Names
         * from XML namespace. But documents authors may not care in
         * their context so let's proceed.
         */
    }

    /*
     * Allocate a new Namespace and fill the fields.
     */
    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
    if (cur == NULL) {
	xmlTreeErrMemory("building namespace");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNs));
    cur->type = XML_LOCAL_NAMESPACE;

    if (href != NULL)
	cur->href = xmlStrdup(href);
    if (prefix != NULL)
	cur->prefix = xmlStrdup(prefix);

    /*
     * Add it at the end to preserve parsing order ...
     * and checks for existing use of the prefix
     */
    if (node != NULL) {
	if (node->nsDef == NULL) {
	    node->nsDef = cur;
	} else {
	    xmlNsPtr prev = node->nsDef;

	    if (((prev->prefix == NULL) && (cur->prefix == NULL)) ||
		(xmlStrEqual(prev->prefix, cur->prefix))) {
		xmlFreeNs(cur);
		return(NULL);
	    }
	    while (prev->next != NULL) {
	        prev = prev->next;
		if (((prev->prefix == NULL) && (cur->prefix == NULL)) ||
		    (xmlStrEqual(prev->prefix, cur->prefix))) {
		    xmlFreeNs(cur);
		    return(NULL);
		}
	    }
	    prev->next = cur;
	}
    }
    return(cur);
}